

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsXMLReader.cxx
# Opt level: O2

string * __thiscall
kws::XMLReader::GetValue(string *__return_storage_ptr__,XMLReader *this,string *tag)

{
  int iVar1;
  string tagt;
  string local_68;
  string local_48;
  
  this->m_CurrentPos = 0;
  GetTag_abi_cxx11_(&local_68,this);
  while (local_68._M_string_length != 0) {
    iVar1 = strcmp(local_68._M_dataplus._M_p,(tag->_M_dataplus)._M_p);
    if (iVar1 == 0) break;
    GetTag_abi_cxx11_(&local_48,this);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_Value);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string XMLReader::GetValue(std::string tag)
{
  m_CurrentPos = 0;
  std::string tagt = this->GetTag();
  while((tagt.length()>0)  && (strcmp(tagt.c_str(),tag.c_str())))
    {
    tagt = this->GetTag();
    }

  return m_Value;
}